

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_RemoveWindowMappingByTarget(GPU_Target *target)

{
  int local_18;
  int num_to_move;
  int i;
  Uint32 windowID;
  GPU_Target *target_local;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    gpu_init_window_mappings();
  }
  if (((target != (GPU_Target *)0x0) && (target->context != (GPU_Context *)0x0)) &&
     (target->context->windowID != 0)) {
    target->context->windowID = 0;
    for (local_18 = 0; local_18 < _gpu_num_window_mappings; local_18 = local_18 + 1) {
      if (_gpu_window_mappings[local_18].target == target) {
        _gpu_num_window_mappings = _gpu_num_window_mappings + -1;
        if (_gpu_num_window_mappings - local_18 < 1) {
          return;
        }
        memmove(_gpu_window_mappings + local_18,_gpu_window_mappings + (local_18 + 1),
                (long)(_gpu_num_window_mappings - local_18) << 4);
        return;
      }
    }
  }
  return;
}

Assistant:

void GPU_RemoveWindowMappingByTarget(GPU_Target* target)
{
    Uint32 windowID;
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(target == NULL || target->context == NULL)
        return;

    windowID = target->context->windowID;
    if(windowID == 0)  // Invalid window ID
        return;

    // Unset the target's window
    target->context->windowID = 0;

    // Find the occurrences
    for(i = 0; i < _gpu_num_window_mappings; ++i)
    {
        if(_gpu_window_mappings[i].target == target)
        {
            // Move the remaining entries to replace the removed one
            int num_to_move;
            _gpu_num_window_mappings--;
            num_to_move = _gpu_num_window_mappings - i;
            if(num_to_move > 0)
                memmove(&_gpu_window_mappings[i], &_gpu_window_mappings[i+1], num_to_move * sizeof(GPU_WindowMapping));
            return;
        }
    }

}